

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

bool testing::internal::ParseInt32(Message *src_text,char *str,Int32 *value)

{
  long lVar1;
  Message *pMVar2;
  ostream *poVar3;
  Message msg;
  char *str_local;
  string local_40;
  char *end;
  
  end = (char *)0x0;
  str_local = str;
  lVar1 = strtol(str,&end,10);
  if (*end == '\0') {
    if ((int)lVar1 == lVar1) {
      *value = (int)lVar1;
      return true;
    }
    Message::Message(&msg);
    poVar3 = (ostream *)((long)msg.ss_.ptr_ + 0x10);
    std::operator<<(poVar3,"WARNING: ");
    testing::operator<<(poVar3,src_text);
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),
                    " is expected to be a 32-bit integer, but actually");
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10)," has value ");
    pMVar2 = Message::operator<<(&msg,&str_local);
    Message::operator<<(pMVar2,(char (*) [20])", which overflows.\n");
    StringStreamToString(&local_40,(stringstream *)msg.ss_.ptr_);
  }
  else {
    Message::Message(&msg);
    poVar3 = (ostream *)((long)msg.ss_.ptr_ + 0x10);
    std::operator<<(poVar3,"WARNING: ");
    testing::operator<<(poVar3,src_text);
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),
                    " is expected to be a 32-bit integer, but actually");
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10)," has value \"");
    pMVar2 = Message::operator<<(&msg,&str_local);
    Message::operator<<(pMVar2,(char (*) [4])"\".\n");
    StringStreamToString(&local_40,(stringstream *)msg.ss_.ptr_);
  }
  printf("%s",local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  fflush(_stdout);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&msg.ss_);
  return false;
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, Int32* value) {
  // Parses the environment variable as a decimal integer.
  char* end = NULL;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const Int32 result = static_cast<Int32>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an Int32.
      ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}